

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint32_t *puVar8;
  uint uVar9;
  uint32_t local_4c;
  uint local_44;
  lzma_match *local_40;
  
  local_40 = matches;
  puVar3 = son + cyclic_pos * 2;
  puVar8 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar7 = pos - cur_match;
  if (uVar7 < cyclic_size && depth != 0) {
    local_4c = len_best;
    uVar9 = 0;
    local_44 = 0;
    do {
      uVar4 = 0;
      if (cyclic_pos < uVar7) {
        uVar4 = cyclic_size;
      }
      uVar2 = uVar9;
      if (local_44 < uVar9) {
        uVar2 = local_44;
      }
      uVar5 = (ulong)uVar2;
      puVar6 = son + (uVar4 + (cyclic_pos - uVar7)) * 2;
      if (cur[uVar5 - uVar7] == cur[uVar5]) {
        uVar2 = uVar2 + 1;
        if (len_limit < uVar2) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if ((int)len_limit < 0) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        uVar4 = len_limit;
        if (uVar2 < len_limit) {
LAB_001b316a:
          uVar5 = *(long *)(cur + ((ulong)uVar2 - (ulong)uVar7)) - *(long *)(cur + uVar2);
          if (uVar5 == 0) goto code_r0x001b3177;
          uVar1 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
            }
          }
          uVar4 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar2;
          if (len_limit <= uVar4) {
            uVar4 = len_limit;
          }
        }
LAB_001b3195:
        if (local_4c < uVar4) {
          local_40->len = uVar4;
          local_40->dist = uVar7 - 1;
          local_40 = local_40 + 1;
          local_4c = uVar4;
          if (uVar4 == len_limit) {
            *puVar3 = *puVar6;
            *puVar8 = puVar6[1];
            return local_40;
          }
        }
        uVar5 = (ulong)uVar4;
      }
      if (cur[uVar5 - uVar7] < cur[uVar5]) {
        *puVar3 = cur_match;
        puVar3 = puVar6 + 1;
        puVar6 = puVar3;
        uVar9 = (uint)uVar5;
      }
      else {
        *puVar8 = cur_match;
        puVar8 = puVar6;
        local_44 = (uint)uVar5;
      }
      depth = depth - 1;
      if (depth == 0) break;
      cur_match = *puVar6;
      uVar7 = pos - cur_match;
    } while (uVar7 < cyclic_size);
  }
  *puVar8 = 0;
  *puVar3 = 0;
  return local_40;
code_r0x001b3177:
  uVar2 = uVar2 + 8;
  if (len_limit <= uVar2) goto LAB_001b3195;
  goto LAB_001b316a;
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		uint32_t *const pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		const uint8_t *const pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}